

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vttdemux.cc
# Opt level: O0

bool libwebm::vttdemux::OpenFiles(metadata_map_t *metadata_map,char *filename)

{
  size_t __end;
  bool bVar1;
  iterator iVar2;
  mapped_type *pmVar3;
  reference ppVar4;
  char *__filename;
  FILE *pFVar5;
  undefined8 uVar6;
  char local_118 [7];
  bool success;
  char str [33];
  allocator<char> local_e9;
  string local_e8 [8];
  string name;
  Type type_1;
  MetadataInfo *info_1;
  reference local_b0;
  value_type *v_1;
  Type local_94;
  MetadataInfo *pMStack_90;
  Type type;
  MetadataInfo *info;
  reference local_80;
  value_type *v;
  iter_t i;
  iter_t j;
  iter_t ii;
  metadata_map_t *m;
  map<libwebm::vttdemux::MetadataInfo::Type,_int,_std::less<libwebm::vttdemux::MetadataInfo::Type>,_std::allocator<std::pair<const_libwebm::vttdemux::MetadataInfo::Type,_int>_>_>
  exists;
  char *ext;
  char *filename_local;
  metadata_map_t *metadata_map_local;
  
  if ((metadata_map == (metadata_map_t *)0x0) ||
     (bVar1 = std::
              map<long,_libwebm::vttdemux::MetadataInfo,_std::less<long>,_std::allocator<std::pair<const_long,_libwebm::vttdemux::MetadataInfo>_>_>
              ::empty(metadata_map), bVar1)) {
    metadata_map_local._7_1_ = 0;
  }
  else if (filename == (char *)0x0) {
    metadata_map_local._7_1_ = 0;
  }
  else {
    exists._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)strrchr(filename,0x2e);
    if ((char *)exists._M_t._M_impl.super__Rb_tree_header._M_node_count == (char *)0x0) {
      metadata_map_local._7_1_ = 0;
    }
    else {
      std::
      map<libwebm::vttdemux::MetadataInfo::Type,_int,_std::less<libwebm::vttdemux::MetadataInfo::Type>,_std::allocator<std::pair<const_libwebm::vttdemux::MetadataInfo::Type,_int>_>_>
      ::map((map<libwebm::vttdemux::MetadataInfo::Type,_int,_std::less<libwebm::vttdemux::MetadataInfo::Type>,_std::allocator<std::pair<const_libwebm::vttdemux::MetadataInfo::Type,_int>_>_>
             *)&m);
      iVar2 = std::
              map<long,_libwebm::vttdemux::MetadataInfo,_std::less<long>,_std::allocator<std::pair<const_long,_libwebm::vttdemux::MetadataInfo>_>_>
              ::begin(metadata_map);
      i._M_node = (_Base_ptr)
                  std::
                  map<long,_libwebm::vttdemux::MetadataInfo,_std::less<long>,_std::allocator<std::pair<const_long,_libwebm::vttdemux::MetadataInfo>_>_>
                  ::end(metadata_map);
      v = (value_type *)iVar2;
      while (bVar1 = std::operator!=((_Self *)&v,&i), bVar1) {
        info = (MetadataInfo *)
               std::_Rb_tree_iterator<std::pair<const_long,_libwebm::vttdemux::MetadataInfo>_>::
               operator++((_Rb_tree_iterator<std::pair<const_long,_libwebm::vttdemux::MetadataInfo>_>
                           *)&v,0);
        local_80 = std::_Rb_tree_iterator<std::pair<const_long,_libwebm::vttdemux::MetadataInfo>_>::
                   operator*((_Rb_tree_iterator<std::pair<const_long,_libwebm::vttdemux::MetadataInfo>_>
                              *)&info);
        pMStack_90 = &local_80->second;
        local_94 = pMStack_90->type;
        pmVar3 = std::
                 map<libwebm::vttdemux::MetadataInfo::Type,_int,_std::less<libwebm::vttdemux::MetadataInfo::Type>,_std::allocator<std::pair<const_libwebm::vttdemux::MetadataInfo::Type,_int>_>_>
                 ::operator[]((map<libwebm::vttdemux::MetadataInfo::Type,_int,_std::less<libwebm::vttdemux::MetadataInfo::Type>,_std::allocator<std::pair<const_libwebm::vttdemux::MetadataInfo::Type,_int>_>_>
                               *)&m,&local_94);
        *pmVar3 = *pmVar3 + 1;
      }
      do {
        v = (value_type *)iVar2._M_node;
        bVar1 = std::operator!=((_Self *)&v,&i);
        if (!bVar1) {
          metadata_map_local._7_1_ = 1;
          stack0xffffffffffffff10 = 1;
          break;
        }
        info_1 = (MetadataInfo *)
                 std::_Rb_tree_iterator<std::pair<const_long,_libwebm::vttdemux::MetadataInfo>_>::
                 operator++((_Rb_tree_iterator<std::pair<const_long,_libwebm::vttdemux::MetadataInfo>_>
                             *)&v,0);
        ppVar4 = std::_Rb_tree_iterator<std::pair<const_long,_libwebm::vttdemux::MetadataInfo>_>::
                 operator*((_Rb_tree_iterator<std::pair<const_long,_libwebm::vttdemux::MetadataInfo>_>
                            *)&info_1);
        __end = exists._M_t._M_impl.super__Rb_tree_header._M_node_count;
        name.field_2._12_4_ = (ppVar4->second).type;
        local_b0 = ppVar4;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<char_const*,void>(local_e8,filename,(char *)__end,&local_e9);
        std::allocator<char>::~allocator(&local_e9);
        switch(name.field_2._12_4_) {
        case 0:
          std::__cxx11::string::operator+=(local_e8,"_SUBTITLES");
          break;
        case 1:
          std::__cxx11::string::operator+=(local_e8,"_CAPTIONS");
          break;
        case 2:
          std::__cxx11::string::operator+=(local_e8,"_DESCRIPTIONS");
          break;
        case 3:
          std::__cxx11::string::operator+=(local_e8,"_METADATA");
          break;
        case 4:
          std::__cxx11::string::operator+=(local_e8,"_CHAPTERS");
          break;
        default:
          metadata_map_local._7_1_ = 0;
          stack0xffffffffffffff10 = 1;
          goto LAB_00119fa8;
        }
        pmVar3 = std::
                 map<libwebm::vttdemux::MetadataInfo::Type,_int,_std::less<libwebm::vttdemux::MetadataInfo::Type>,_std::allocator<std::pair<const_libwebm::vttdemux::MetadataInfo::Type,_int>_>_>
                 ::operator[]((map<libwebm::vttdemux::MetadataInfo::Type,_int,_std::less<libwebm::vttdemux::MetadataInfo::Type>,_std::allocator<std::pair<const_libwebm::vttdemux::MetadataInfo::Type,_int>_>_>
                               *)&m,(key_type *)(name.field_2._M_local_buf + 0xc));
        if (1 < *pmVar3) {
          snprintf(local_118,0x21,"%ld",local_b0->first);
          std::__cxx11::string::operator+=(local_e8,local_118);
        }
        std::__cxx11::string::operator+=(local_e8,".vtt");
        __filename = (char *)std::__cxx11::string::c_str();
        pFVar5 = fopen(__filename,"wb");
        (ppVar4->second).file = (FILE *)pFVar5;
        if ((ppVar4->second).file == (FILE *)0x0) {
          uVar6 = std::__cxx11::string::c_str();
          printf("unable to open output file %s\n",uVar6);
          metadata_map_local._7_1_ = 0;
          stack0xffffffffffffff10 = 1;
        }
        else {
          stack0xffffffffffffff10 = 0;
        }
LAB_00119fa8:
        std::__cxx11::string::~string(local_e8);
        iVar2._M_node = (_Base_ptr)v;
      } while (stack0xffffffffffffff10 == 0);
      std::
      map<libwebm::vttdemux::MetadataInfo::Type,_int,_std::less<libwebm::vttdemux::MetadataInfo::Type>,_std::allocator<std::pair<const_libwebm::vttdemux::MetadataInfo::Type,_int>_>_>
      ::~map((map<libwebm::vttdemux::MetadataInfo::Type,_int,_std::less<libwebm::vttdemux::MetadataInfo::Type>,_std::allocator<std::pair<const_libwebm::vttdemux::MetadataInfo::Type,_int>_>_>
              *)&m);
    }
  }
  return (bool)(metadata_map_local._7_1_ & 1);
}

Assistant:

bool vttdemux::OpenFiles(metadata_map_t* metadata_map, const char* filename) {
  if (metadata_map == NULL || metadata_map->empty())
    return false;

  if (filename == NULL)
    return false;

  // Find the position of the filename extension.  We synthesize the
  // output filename from the directory path and basename of the input
  // filename.

  const char* const ext = strrchr(filename, '.');

  if (ext == NULL)  // TODO(matthewjheaney): liberalize?
    return false;

  // Remember whether a track of this type has already been seen (the
  // map key) by keeping a count (the map item).  We quality the
  // output filename with the track number if there is more than one
  // track having a given type.

  std::map<MetadataInfo::Type, int> exists;

  typedef metadata_map_t::iterator iter_t;

  metadata_map_t& m = *metadata_map;
  const iter_t ii = m.begin();
  const iter_t j = m.end();

  // Make a first pass over the cache to determine whether there is
  // more than one track corresponding to a given metadata type.

  iter_t i = ii;
  while (i != j) {
    const metadata_map_t::value_type& v = *i++;
    const MetadataInfo& info = v.second;
    const MetadataInfo::Type type = info.type;
    ++exists[type];
  }

  // Make a second pass over the cache, synthesizing the filename of
  // each output file (from the input file basename, the input track
  // metadata type, and its track number if necessary), and then
  // opening a WebVTT output file having that filename.

  i = ii;
  while (i != j) {
    metadata_map_t::value_type& v = *i++;
    MetadataInfo& info = v.second;
    const MetadataInfo::Type type = info.type;

    // Start with the basename of the input file.

    string name(filename, ext);

    // Next append the metadata kind.

    switch (type) {
      case MetadataInfo::kSubtitles:
        name += "_SUBTITLES";
        break;

      case MetadataInfo::kCaptions:
        name += "_CAPTIONS";
        break;

      case MetadataInfo::kDescriptions:
        name += "_DESCRIPTIONS";
        break;

      case MetadataInfo::kMetadata:
        name += "_METADATA";
        break;

      case MetadataInfo::kChapters:
        name += "_CHAPTERS";
        break;

      default:
        return false;
    }

    // If there is more than one metadata track having a given type
    // (the WebVTT-in-WebM spec doesn't preclude this), then qualify
    // the output filename with the input track number.

    if (exists[type] > 1) {
      enum { kLen = 33 };
      char str[kLen];  // max 126 tracks, so only 4 chars really needed
#ifndef _MSC_VER
      snprintf(str, kLen, "%ld", v.first);  // track number
#else
      _snprintf_s(str, sizeof(str), kLen, "%ld", v.first);  // track number
#endif
      name += str;
    }

    // Finally append the output filename extension.

    name += ".vtt";

    // We have synthesized the full output filename, so attempt to
    // open the WebVTT output file.

    info.file = fopen(name.c_str(), "wb");
    const bool success = (info.file != NULL);

    if (!success) {
      printf("unable to open output file %s\n", name.c_str());
      return false;
    }
  }

  return true;
}